

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_copy.cpp
# Opt level: O0

void __thiscall ON_SubDimple::ON_SubDimple(ON_SubDimple *this,ON_SubDimple *src)

{
  ON_SubDLevel *src_level_00;
  ON__UINT64 OVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  unsigned_short uVar5;
  unsigned_short uVar6;
  ON_SubDHashType OVar7;
  undefined3 uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  bool bVar14;
  __int_type_conflict _Var15;
  ON_SubDLevel **ppOVar16;
  ON_SubDLevel *this_00;
  ON__UINT64 OVar17;
  ON__UINT64 local_138;
  ON_SubDLevel *level;
  ON_SubDLevel *src_level_1;
  undefined1 local_b0 [4];
  uint level_index;
  ON_SubDArchiveIdMap eptrlist;
  ON_SubDLevel *src_level;
  uint level_count;
  bool bCopyComponentStatus;
  ON_SubDimple *src_local;
  ON_SubDimple *this_local;
  
  _Var15 = std::__atomic_base<unsigned_long>::operator++
                     (&Internal_RuntimeSerialNumberGenerator.super___atomic_base<unsigned_long>);
  this->RuntimeSerialNumber = _Var15;
  this->m_subd_geometry_content_serial_number = 0;
  this->m_subd_render_content_serial_number = 0;
  uVar2 = ON_SubDHash::Empty._88_8_;
  *(undefined8 *)((this->m_subd_toplology_hash).m_face_hash.m_digest + 8) =
       ON_SubDHash::Empty.m_face_hash.m_digest._8_8_;
  *(undefined8 *)((this->m_subd_toplology_hash).m_face_hash.m_digest + 0x10) = uVar2;
  uVar2 = ON_SubDHash::Empty.m_face_hash.m_digest._0_8_;
  *(undefined8 *)((this->m_subd_toplology_hash).m_edge_hash.m_digest + 0xc) =
       ON_SubDHash::Empty.m_edge_hash.m_digest._12_8_;
  *(undefined8 *)(this->m_subd_toplology_hash).m_face_hash.m_digest = uVar2;
  uVar13 = ON_SubDHash::Empty.m_edge_hash.m_digest._4_8_;
  uVar12 = ON_SubDHash::Empty.m_vertex_hash.m_digest._8_8_;
  uVar3 = ON_SubDHash::Empty.m_vertex_hash.m_digest._0_8_;
  OVar17 = ON_SubDHash::Empty.m_subd_geometry_content_serial_number;
  OVar1 = ON_SubDHash::Empty.m_subd_runtime_serial_number;
  uVar4 = ON_SubDHash::Empty._8_8_;
  uVar2 = ON_SubDHash::Empty._0_8_;
  *(undefined8 *)((this->m_subd_toplology_hash).m_vertex_hash.m_digest + 0x10) =
       ON_SubDHash::Empty._48_8_;
  *(undefined8 *)((this->m_subd_toplology_hash).m_edge_hash.m_digest + 4) = uVar13;
  *(undefined8 *)(this->m_subd_toplology_hash).m_vertex_hash.m_digest = uVar3;
  *(undefined8 *)((this->m_subd_toplology_hash).m_vertex_hash.m_digest + 8) = uVar12;
  (this->m_subd_toplology_hash).m_subd_runtime_serial_number = OVar1;
  (this->m_subd_toplology_hash).m_subd_geometry_content_serial_number = OVar17;
  uVar3 = ON_SubDHash::Empty._0_8_;
  ON_SubDHash::Empty.m_hash_type = (ON_SubDHashType)uVar2;
  ON_SubDHash::Empty._1_3_ = SUB83(uVar2,1);
  uVar8 = ON_SubDHash::Empty._1_3_;
  ON_SubDHash::Empty.m_vertex_count = SUB84(uVar2,4);
  uVar9 = ON_SubDHash::Empty.m_vertex_count;
  (this->m_subd_toplology_hash).m_hash_type = ON_SubDHash::Empty.m_hash_type;
  ON_SubDHash::Empty._0_8_ = uVar3;
  uVar2 = ON_SubDHash::Empty._8_8_;
  *(undefined3 *)&(this->m_subd_toplology_hash).field_0x1 = uVar8;
  (this->m_subd_toplology_hash).m_vertex_count = uVar9;
  ON_SubDHash::Empty.m_edge_count = (uint)uVar4;
  ON_SubDHash::Empty.m_face_count = SUB84(uVar4,4);
  uVar9 = ON_SubDHash::Empty.m_face_count;
  (this->m_subd_toplology_hash).m_edge_count = ON_SubDHash::Empty.m_edge_count;
  ON_SubDHash::Empty._8_8_ = uVar2;
  uVar2 = ON_SubDHash::Empty._88_8_;
  (this->m_subd_toplology_hash).m_face_count = uVar9;
  *(undefined8 *)((this->m_subd_toplology_and_edge_creases_hash).m_face_hash.m_digest + 8) =
       ON_SubDHash::Empty.m_face_hash.m_digest._8_8_;
  *(undefined8 *)((this->m_subd_toplology_and_edge_creases_hash).m_face_hash.m_digest + 0x10) =
       uVar2;
  uVar2 = ON_SubDHash::Empty.m_face_hash.m_digest._0_8_;
  *(undefined8 *)((this->m_subd_toplology_and_edge_creases_hash).m_edge_hash.m_digest + 0xc) =
       ON_SubDHash::Empty.m_edge_hash.m_digest._12_8_;
  *(undefined8 *)(this->m_subd_toplology_and_edge_creases_hash).m_face_hash.m_digest = uVar2;
  uVar13 = ON_SubDHash::Empty.m_edge_hash.m_digest._4_8_;
  uVar12 = ON_SubDHash::Empty.m_vertex_hash.m_digest._8_8_;
  uVar3 = ON_SubDHash::Empty.m_vertex_hash.m_digest._0_8_;
  OVar17 = ON_SubDHash::Empty.m_subd_geometry_content_serial_number;
  OVar1 = ON_SubDHash::Empty.m_subd_runtime_serial_number;
  uVar4 = ON_SubDHash::Empty._8_8_;
  uVar2 = ON_SubDHash::Empty._0_8_;
  *(undefined8 *)((this->m_subd_toplology_and_edge_creases_hash).m_vertex_hash.m_digest + 0x10) =
       ON_SubDHash::Empty._48_8_;
  *(undefined8 *)((this->m_subd_toplology_and_edge_creases_hash).m_edge_hash.m_digest + 4) = uVar13;
  *(undefined8 *)(this->m_subd_toplology_and_edge_creases_hash).m_vertex_hash.m_digest = uVar3;
  *(undefined8 *)((this->m_subd_toplology_and_edge_creases_hash).m_vertex_hash.m_digest + 8) =
       uVar12;
  (this->m_subd_toplology_and_edge_creases_hash).m_subd_runtime_serial_number = OVar1;
  (this->m_subd_toplology_and_edge_creases_hash).m_subd_geometry_content_serial_number = OVar17;
  uVar3 = ON_SubDHash::Empty._0_8_;
  ON_SubDHash::Empty.m_hash_type = (ON_SubDHashType)uVar2;
  ON_SubDHash::Empty._1_3_ = SUB83(uVar2,1);
  uVar8 = ON_SubDHash::Empty._1_3_;
  ON_SubDHash::Empty.m_vertex_count = SUB84(uVar2,4);
  uVar9 = ON_SubDHash::Empty.m_vertex_count;
  (this->m_subd_toplology_and_edge_creases_hash).m_hash_type = ON_SubDHash::Empty.m_hash_type;
  ON_SubDHash::Empty._0_8_ = uVar3;
  uVar2 = ON_SubDHash::Empty._8_8_;
  *(undefined3 *)&(this->m_subd_toplology_and_edge_creases_hash).field_0x1 = uVar8;
  (this->m_subd_toplology_and_edge_creases_hash).m_vertex_count = uVar9;
  ON_SubDHash::Empty.m_edge_count = (uint)uVar4;
  ON_SubDHash::Empty.m_face_count = SUB84(uVar4,4);
  uVar9 = ON_SubDHash::Empty.m_face_count;
  (this->m_subd_toplology_and_edge_creases_hash).m_edge_count = ON_SubDHash::Empty.m_edge_count;
  ON_SubDHash::Empty._8_8_ = uVar2;
  uVar2 = ON_SubDHash::Empty._88_8_;
  (this->m_subd_toplology_and_edge_creases_hash).m_face_count = uVar9;
  *(undefined8 *)((this->m_subd_geometry_hash).m_face_hash.m_digest + 8) =
       ON_SubDHash::Empty.m_face_hash.m_digest._8_8_;
  *(undefined8 *)((this->m_subd_geometry_hash).m_face_hash.m_digest + 0x10) = uVar2;
  uVar2 = ON_SubDHash::Empty.m_face_hash.m_digest._0_8_;
  *(undefined8 *)((this->m_subd_geometry_hash).m_edge_hash.m_digest + 0xc) =
       ON_SubDHash::Empty.m_edge_hash.m_digest._12_8_;
  *(undefined8 *)(this->m_subd_geometry_hash).m_face_hash.m_digest = uVar2;
  uVar13 = ON_SubDHash::Empty.m_edge_hash.m_digest._4_8_;
  uVar12 = ON_SubDHash::Empty.m_vertex_hash.m_digest._8_8_;
  uVar3 = ON_SubDHash::Empty.m_vertex_hash.m_digest._0_8_;
  OVar17 = ON_SubDHash::Empty.m_subd_geometry_content_serial_number;
  OVar1 = ON_SubDHash::Empty.m_subd_runtime_serial_number;
  uVar4 = ON_SubDHash::Empty._8_8_;
  uVar2 = ON_SubDHash::Empty._0_8_;
  *(undefined8 *)((this->m_subd_geometry_hash).m_vertex_hash.m_digest + 0x10) =
       ON_SubDHash::Empty._48_8_;
  *(undefined8 *)((this->m_subd_geometry_hash).m_edge_hash.m_digest + 4) = uVar13;
  *(undefined8 *)(this->m_subd_geometry_hash).m_vertex_hash.m_digest = uVar3;
  *(undefined8 *)((this->m_subd_geometry_hash).m_vertex_hash.m_digest + 8) = uVar12;
  (this->m_subd_geometry_hash).m_subd_runtime_serial_number = OVar1;
  (this->m_subd_geometry_hash).m_subd_geometry_content_serial_number = OVar17;
  uVar3 = ON_SubDHash::Empty._0_8_;
  ON_SubDHash::Empty.m_hash_type = (ON_SubDHashType)uVar2;
  ON_SubDHash::Empty._1_3_ = SUB83(uVar2,1);
  uVar8 = ON_SubDHash::Empty._1_3_;
  ON_SubDHash::Empty.m_vertex_count = SUB84(uVar2,4);
  uVar9 = ON_SubDHash::Empty.m_vertex_count;
  (this->m_subd_geometry_hash).m_hash_type = ON_SubDHash::Empty.m_hash_type;
  ON_SubDHash::Empty._0_8_ = uVar3;
  uVar2 = ON_SubDHash::Empty._8_8_;
  *(undefined3 *)&(this->m_subd_geometry_hash).field_0x1 = uVar8;
  (this->m_subd_geometry_hash).m_vertex_count = uVar9;
  ON_SubDHash::Empty.m_edge_count = (uint)uVar4;
  ON_SubDHash::Empty.m_face_count = SUB84(uVar4,4);
  uVar9 = ON_SubDHash::Empty.m_face_count;
  (this->m_subd_geometry_hash).m_edge_count = ON_SubDHash::Empty.m_edge_count;
  ON_SubDHash::Empty._8_8_ = uVar2;
  (this->m_subd_geometry_hash).m_face_count = uVar9;
  ON_SubDHeap::ON_SubDHeap(&this->m_heap);
  this->m_subd_appearance = Surface;
  this->m_texture_coordinate_type = Unset;
  this->m_reserved = 0;
  ON_MappingTag::ON_MappingTag(&this->m_texture_mapping_tag);
  ON_MappingTag::ON_MappingTag(&this->m_colors_mapping_tag);
  *(undefined4 *)((this->m_fragment_texture_settings_hash).m_digest + 0x10) =
       ON_SHA1_Hash::EmptyContentHash.m_digest._16_4_;
  uVar2 = ON_SHA1_Hash::EmptyContentHash.m_digest._8_8_;
  *(undefined8 *)(this->m_fragment_texture_settings_hash).m_digest =
       ON_SHA1_Hash::EmptyContentHash.m_digest._0_8_;
  *(undefined8 *)((this->m_fragment_texture_settings_hash).m_digest + 8) = uVar2;
  *(undefined4 *)((this->m_fragment_colors_settings_hash).m_digest + 0x10) =
       ON_SHA1_Hash::EmptyContentHash.m_digest._16_4_;
  uVar2 = ON_SHA1_Hash::EmptyContentHash.m_digest._8_8_;
  *(undefined8 *)(this->m_fragment_colors_settings_hash).m_digest =
       ON_SHA1_Hash::EmptyContentHash.m_digest._0_8_;
  *(undefined8 *)((this->m_fragment_colors_settings_hash).m_digest + 8) = uVar2;
  ON_SimpleArray<ON_SubDLevel_*>::ON_SimpleArray(&this->m_levels);
  this->m_active_level = (ON_SubDLevel *)0x0;
  (this->m_face_packing_id).Data1 = 0;
  (this->m_face_packing_id).Data2 = 0;
  (this->m_face_packing_id).Data3 = 0;
  (this->m_face_packing_id).Data4[0] = '\0';
  uVar2 = ON_SubDHash::Empty._88_8_;
  (this->m_face_packing_id).Data4[1] = '\0';
  (this->m_face_packing_id).Data4[2] = '\0';
  (this->m_face_packing_id).Data4[3] = '\0';
  (this->m_face_packing_id).Data4[4] = '\0';
  (this->m_face_packing_id).Data4[5] = '\0';
  (this->m_face_packing_id).Data4[6] = '\0';
  (this->m_face_packing_id).Data4[7] = '\0';
  *(undefined8 *)((this->m_face_packing_topology_hash).m_face_hash.m_digest + 8) =
       ON_SubDHash::Empty.m_face_hash.m_digest._8_8_;
  *(undefined8 *)((this->m_face_packing_topology_hash).m_face_hash.m_digest + 0x10) = uVar2;
  uVar2 = ON_SubDHash::Empty.m_face_hash.m_digest._0_8_;
  *(undefined8 *)((this->m_face_packing_topology_hash).m_edge_hash.m_digest + 0xc) =
       ON_SubDHash::Empty.m_edge_hash.m_digest._12_8_;
  *(undefined8 *)(this->m_face_packing_topology_hash).m_face_hash.m_digest = uVar2;
  uVar13 = ON_SubDHash::Empty.m_edge_hash.m_digest._4_8_;
  uVar12 = ON_SubDHash::Empty.m_vertex_hash.m_digest._8_8_;
  uVar3 = ON_SubDHash::Empty.m_vertex_hash.m_digest._0_8_;
  OVar17 = ON_SubDHash::Empty.m_subd_geometry_content_serial_number;
  OVar1 = ON_SubDHash::Empty.m_subd_runtime_serial_number;
  uVar4 = ON_SubDHash::Empty._8_8_;
  uVar2 = ON_SubDHash::Empty._0_8_;
  *(undefined8 *)((this->m_face_packing_topology_hash).m_vertex_hash.m_digest + 0x10) =
       ON_SubDHash::Empty._48_8_;
  *(undefined8 *)((this->m_face_packing_topology_hash).m_edge_hash.m_digest + 4) = uVar13;
  *(undefined8 *)(this->m_face_packing_topology_hash).m_vertex_hash.m_digest = uVar3;
  *(undefined8 *)((this->m_face_packing_topology_hash).m_vertex_hash.m_digest + 8) = uVar12;
  (this->m_face_packing_topology_hash).m_subd_runtime_serial_number = OVar1;
  (this->m_face_packing_topology_hash).m_subd_geometry_content_serial_number = OVar17;
  uVar3 = ON_SubDHash::Empty._0_8_;
  ON_SubDHash::Empty.m_hash_type = (ON_SubDHashType)uVar2;
  ON_SubDHash::Empty._1_3_ = SUB83(uVar2,1);
  uVar8 = ON_SubDHash::Empty._1_3_;
  ON_SubDHash::Empty.m_vertex_count = SUB84(uVar2,4);
  uVar9 = ON_SubDHash::Empty.m_vertex_count;
  (this->m_face_packing_topology_hash).m_hash_type = ON_SubDHash::Empty.m_hash_type;
  ON_SubDHash::Empty._0_8_ = uVar3;
  uVar2 = ON_SubDHash::Empty._8_8_;
  *(undefined3 *)&(this->m_face_packing_topology_hash).field_0x1 = uVar8;
  (this->m_face_packing_topology_hash).m_vertex_count = uVar9;
  ON_SubDHash::Empty.m_edge_count = (uint)uVar4;
  ON_SubDHash::Empty.m_face_count = SUB84(uVar4,4);
  uVar9 = ON_SubDHash::Empty.m_face_count;
  (this->m_face_packing_topology_hash).m_edge_count = ON_SubDHash::Empty.m_edge_count;
  ON_SubDHash::Empty._8_8_ = uVar2;
  (this->m_face_packing_topology_hash).m_face_count = uVar9;
  ON_Symmetry::ON_Symmetry(&this->m_symmetry);
  for (src_level._4_4_ = ON_SimpleArray<ON_SubDLevel_*>::UnsignedCount(&src->m_levels);
      src_level._4_4_ != 0; src_level._4_4_ = src_level._4_4_ - 1) {
    ppOVar16 = ON_SimpleArray<ON_SubDLevel_*>::operator[](&src->m_levels,src_level._4_4_ - 1);
    eptrlist.m_fsp_it.m_it_element = *ppOVar16;
    if ((((ON_SubDLevel *)eptrlist.m_fsp_it.m_it_element != (ON_SubDLevel *)0x0) &&
        (((ON_SubDLevel *)eptrlist.m_fsp_it.m_it_element)->m_vertex[0] != (ON_SubDVertex *)0x0)) &&
       (((ON_SubDLevel *)eptrlist.m_fsp_it.m_it_element)->m_edge[0] != (ON_SubDEdge *)0x0)) break;
  }
  ON_SubDArchiveIdMap::ON_SubDArchiveIdMap((ON_SubDArchiveIdMap *)local_b0);
  ON_SimpleArray<ON_SubDLevel_*>::Reserve(&this->m_levels,(ulong)src_level._4_4_);
  for (src_level_1._4_4_ = 0; src_level_1._4_4_ < src_level._4_4_;
      src_level_1._4_4_ = src_level_1._4_4_ + 1) {
    ppOVar16 = ON_SimpleArray<ON_SubDLevel_*>::operator[](&src->m_levels,src_level_1._4_4_);
    src_level_00 = *ppOVar16;
    this_00 = SubDLevel(this,src_level_1._4_4_,true);
    if ((this_00 == (ON_SubDLevel *)0x0) ||
       (bVar14 = ON_SubDLevel::CopyHelper
                           (this_00,src,src_level_00,(ON_SubDArchiveIdMap *)local_b0,this,true),
       !bVar14)) break;
    if (src->m_active_level == src_level_00) {
      this->m_active_level = this_00;
    }
  }
  this->m_subd_geometry_content_serial_number = src->m_subd_geometry_content_serial_number;
  this->m_subd_render_content_serial_number = src->m_subd_render_content_serial_number;
  this->m_subd_appearance = src->m_subd_appearance;
  this->m_texture_coordinate_type = src->m_texture_coordinate_type;
  memcpy(&this->m_texture_mapping_tag,&src->m_texture_mapping_tag,0x98);
  memcpy(&this->m_colors_mapping_tag,&src->m_colors_mapping_tag,0x98);
  uVar5 = (src->m_face_packing_id).Data2;
  uVar6 = (src->m_face_packing_id).Data3;
  uVar2 = *(undefined8 *)(src->m_face_packing_id).Data4;
  (this->m_face_packing_id).Data1 = (src->m_face_packing_id).Data1;
  (this->m_face_packing_id).Data2 = uVar5;
  (this->m_face_packing_id).Data3 = uVar6;
  *(undefined8 *)(this->m_face_packing_id).Data4 = uVar2;
  uVar2 = *(undefined8 *)((src->m_face_packing_topology_hash).m_face_hash.m_digest + 0xc);
  *(undefined8 *)((this->m_face_packing_topology_hash).m_face_hash.m_digest + 4) =
       *(undefined8 *)((src->m_face_packing_topology_hash).m_face_hash.m_digest + 4);
  *(undefined8 *)((this->m_face_packing_topology_hash).m_face_hash.m_digest + 0xc) = uVar2;
  uVar2 = *(undefined8 *)(src->m_face_packing_topology_hash).m_face_hash.m_digest;
  *(undefined8 *)((this->m_face_packing_topology_hash).m_edge_hash.m_digest + 0xc) =
       *(undefined8 *)((src->m_face_packing_topology_hash).m_edge_hash.m_digest + 0xc);
  *(undefined8 *)(this->m_face_packing_topology_hash).m_face_hash.m_digest = uVar2;
  OVar7 = (src->m_face_packing_topology_hash).m_hash_type;
  uVar8 = *(undefined3 *)&(src->m_face_packing_topology_hash).field_0x1;
  uVar9 = (src->m_face_packing_topology_hash).m_vertex_count;
  uVar10 = (src->m_face_packing_topology_hash).m_edge_count;
  uVar11 = (src->m_face_packing_topology_hash).m_face_count;
  OVar1 = (src->m_face_packing_topology_hash).m_subd_runtime_serial_number;
  OVar17 = (src->m_face_packing_topology_hash).m_subd_geometry_content_serial_number;
  uVar2 = *(undefined8 *)(src->m_face_packing_topology_hash).m_vertex_hash.m_digest;
  uVar3 = *(undefined8 *)((src->m_face_packing_topology_hash).m_vertex_hash.m_digest + 8);
  uVar4 = *(undefined8 *)((src->m_face_packing_topology_hash).m_edge_hash.m_digest + 4);
  *(undefined8 *)((this->m_face_packing_topology_hash).m_vertex_hash.m_digest + 0x10) =
       *(undefined8 *)((src->m_face_packing_topology_hash).m_vertex_hash.m_digest + 0x10);
  *(undefined8 *)((this->m_face_packing_topology_hash).m_edge_hash.m_digest + 4) = uVar4;
  *(undefined8 *)(this->m_face_packing_topology_hash).m_vertex_hash.m_digest = uVar2;
  *(undefined8 *)((this->m_face_packing_topology_hash).m_vertex_hash.m_digest + 8) = uVar3;
  (this->m_face_packing_topology_hash).m_subd_runtime_serial_number = OVar1;
  (this->m_face_packing_topology_hash).m_subd_geometry_content_serial_number = OVar17;
  (this->m_face_packing_topology_hash).m_hash_type = OVar7;
  *(undefined3 *)&(this->m_face_packing_topology_hash).field_0x1 = uVar8;
  (this->m_face_packing_topology_hash).m_vertex_count = uVar9;
  (this->m_face_packing_topology_hash).m_edge_count = uVar10;
  (this->m_face_packing_topology_hash).m_face_count = uVar11;
  OVar1 = src->RuntimeSerialNumber;
  OVar17 = ON_SubDHash::SubDRuntimeSerialNumber(&src->m_face_packing_topology_hash);
  if (OVar1 == OVar17) {
    local_138 = this->RuntimeSerialNumber;
  }
  else {
    local_138 = 0;
  }
  (this->m_face_packing_topology_hash).m_subd_runtime_serial_number = local_138;
  if ((this->m_face_packing_topology_hash).m_subd_runtime_serial_number == 0) {
    (this->m_face_packing_topology_hash).m_subd_geometry_content_serial_number = 0;
  }
  memcpy(&this->m_symmetry,&src->m_symmetry,0x1a0);
  OVar1 = src->RuntimeSerialNumber;
  OVar17 = ON_SubDHash::SubDRuntimeSerialNumber(&src->m_subd_toplology_hash);
  if ((OVar1 == OVar17) &&
     (OVar1 = this->m_subd_geometry_content_serial_number,
     OVar17 = ON_SubDHash::SubDGeometryContentSerialNumber(&src->m_subd_toplology_hash),
     OVar1 == OVar17)) {
    memcpy(&this->m_subd_toplology_hash,&src->m_subd_toplology_hash,0x5c);
    (this->m_subd_toplology_hash).m_subd_runtime_serial_number = this->RuntimeSerialNumber;
  }
  OVar1 = src->RuntimeSerialNumber;
  OVar17 = ON_SubDHash::SubDRuntimeSerialNumber(&src->m_subd_toplology_and_edge_creases_hash);
  if ((OVar1 == OVar17) &&
     (OVar1 = this->m_subd_geometry_content_serial_number,
     OVar17 = ON_SubDHash::SubDGeometryContentSerialNumber
                        (&src->m_subd_toplology_and_edge_creases_hash), OVar1 == OVar17)) {
    memcpy(&this->m_subd_toplology_and_edge_creases_hash,
           &src->m_subd_toplology_and_edge_creases_hash,0x5c);
    (this->m_subd_toplology_and_edge_creases_hash).m_subd_runtime_serial_number =
         this->RuntimeSerialNumber;
  }
  OVar1 = src->RuntimeSerialNumber;
  OVar17 = ON_SubDHash::SubDRuntimeSerialNumber(&src->m_subd_geometry_hash);
  if ((OVar1 == OVar17) &&
     (OVar1 = this->m_subd_geometry_content_serial_number,
     OVar17 = ON_SubDHash::SubDGeometryContentSerialNumber(&src->m_subd_geometry_hash),
     OVar1 == OVar17)) {
    memcpy(&this->m_subd_geometry_hash,&src->m_subd_geometry_hash,0x5c);
    (this->m_subd_geometry_hash).m_subd_runtime_serial_number = this->RuntimeSerialNumber;
  }
  ON_SubDArchiveIdMap::~ON_SubDArchiveIdMap((ON_SubDArchiveIdMap *)local_b0);
  return;
}

Assistant:

ON_SubDimple::ON_SubDimple(const ON_SubDimple& src)
  : RuntimeSerialNumber(++ON_SubDimple::Internal_RuntimeSerialNumberGenerator)
{
  const bool bCopyComponentStatus = true;

  unsigned level_count = src.m_levels.UnsignedCount();
  for (/*empty init*/; level_count > 0; level_count--)
  {
    const ON_SubDLevel* src_level = src.m_levels[level_count - 1];
    if (nullptr == src_level)
      continue;
    if (nullptr == src_level->m_vertex[0])
      continue;
    if (nullptr == src_level->m_edge[0])
      continue;
    // it's ok to have subd with just vertices and edges.
    //NO//if (nullptr == src_level->m_face[0])
    //NO//  continue;
    break;
  }

  ON_SubDArchiveIdMap eptrlist;
  m_levels.Reserve(level_count);
  for (unsigned int level_index = 0; level_index < level_count; level_index++)
  {
    const ON_SubDLevel* src_level = src.m_levels[level_index];
    ON_SubDLevel* level = SubDLevel(level_index,true);
    if (nullptr == level)
      break;
    if (false == level->CopyHelper(src, *src_level, eptrlist, *this, bCopyComponentStatus))
      break;
    if ( src.m_active_level == src_level )
      m_active_level = level;
  }

  // this ON_SubDimple is an exact copy of src, so they have identical geometry 
  // and render content.
  m_subd_geometry_content_serial_number = src.m_subd_geometry_content_serial_number;
  m_subd_render_content_serial_number = src.m_subd_render_content_serial_number;

  m_subd_appearance = src.m_subd_appearance;
  m_texture_coordinate_type = src.m_texture_coordinate_type;
  m_texture_mapping_tag = src.m_texture_mapping_tag;
  m_colors_mapping_tag = src.m_colors_mapping_tag;

  // NOTE WELL: (Dale Lear Aug 2023)
  // Fragment settings like the two m_fragment_... values 
  // should be copied only if the mesh fragments are copied
  // and that happens conditionally and happens later
  // if ON_SubDimple::CopyEvaluationCacheForExperts() is called.
  // NO // m_fragment_texture_settings_hash = src.m_fragment_texture_settings_hash;
  // NO // m_fragment_colors_settings_hash = src.m_fragment_colors_settings_hash;

  m_face_packing_id = src.m_face_packing_id;
  m_face_packing_topology_hash = src.m_face_packing_topology_hash;
  m_face_packing_topology_hash.m_subd_runtime_serial_number
    = (src.RuntimeSerialNumber == src.m_face_packing_topology_hash.SubDRuntimeSerialNumber())
    ? this->RuntimeSerialNumber
    : 0;
  if (0 == m_face_packing_topology_hash.m_subd_runtime_serial_number)
    m_face_packing_topology_hash.m_subd_geometry_content_serial_number = 0;

  m_symmetry = src.m_symmetry;

  if (
    src.RuntimeSerialNumber == src.m_subd_toplology_hash.SubDRuntimeSerialNumber()
    && m_subd_geometry_content_serial_number == src.m_subd_toplology_hash.SubDGeometryContentSerialNumber()
    )
  {
    // src.m_subd_toplology_hash is valid - copy it to this
    m_subd_toplology_hash = src.m_subd_toplology_hash;
    m_subd_toplology_hash.m_subd_runtime_serial_number = this->RuntimeSerialNumber;
  }

  if (
    src.RuntimeSerialNumber == src.m_subd_toplology_and_edge_creases_hash.SubDRuntimeSerialNumber()
    && m_subd_geometry_content_serial_number == src.m_subd_toplology_and_edge_creases_hash.SubDGeometryContentSerialNumber()
    )
  {
    // src.m_subd_toplology_and_edge_crease_hash is valid - copy it to this
    m_subd_toplology_and_edge_creases_hash = src.m_subd_toplology_and_edge_creases_hash;
    m_subd_toplology_and_edge_creases_hash.m_subd_runtime_serial_number = this->RuntimeSerialNumber;
  }

  if (
    src.RuntimeSerialNumber == src.m_subd_geometry_hash.SubDRuntimeSerialNumber()
    && m_subd_geometry_content_serial_number == src.m_subd_geometry_hash.SubDGeometryContentSerialNumber()
    )
  {
    // src.m_subd_geometry_hash is valid - copy it to this.
    m_subd_geometry_hash = src.m_subd_geometry_hash;
    m_subd_geometry_hash.m_subd_runtime_serial_number = this->RuntimeSerialNumber;
  }
}